

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_type
          (CompilerMSL *this,uint32_t mbr_type_id,SPIRType *struct_type,uint32_t *mbr_idx,
          uint32_t *arg_buff_index,uint32_t count)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this_00;
  TypedID<(spirv_cross::Types)1> local_88 [4];
  spirv_cross local_78 [36];
  TypeID local_54;
  TypedID<(spirv_cross::Types)1> local_50;
  bool local_49;
  SPIRType *local_48;
  SPIRType *ary_type;
  uint32_t local_38;
  uint32_t ary_type_id;
  uint32_t type_id;
  uint32_t count_local;
  uint32_t *arg_buff_index_local;
  uint32_t *mbr_idx_local;
  SPIRType *struct_type_local;
  CompilerMSL *pCStack_10;
  uint32_t mbr_type_id_local;
  CompilerMSL *this_local;
  
  local_38 = mbr_type_id;
  ary_type_id = count;
  _type_id = arg_buff_index;
  arg_buff_index_local = mbr_idx;
  mbr_idx_local = (uint32_t *)struct_type;
  struct_type_local._4_4_ = mbr_type_id;
  pCStack_10 = this;
  if (1 < count) {
    ary_type._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    local_48 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,ary_type._4_4_);
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_38);
    SPIRType::operator=(local_48,pSVar2);
    SmallVector<unsigned_int,_8UL>::push_back(&local_48->array,&ary_type_id);
    local_49 = true;
    SmallVector<bool,_8UL>::push_back(&local_48->array_size_literal,&local_49);
    TypedID<(spirv_cross::Types)1>::TypedID(&local_50,local_38);
    (local_48->parent_type).id = local_50.id;
    local_38 = ary_type._4_4_;
  }
  local_54.id = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)(mbr_idx_local + 2));
  uVar1 = *arg_buff_index_local;
  join<char_const(&)[3],unsigned_int&,char_const(&)[5]>
            (local_78,(char (*) [3])0x5c8a11,_type_id,(char (*) [5])"_pad");
  Compiler::set_member_name((Compiler *)this,local_54,uVar1,(string *)local_78);
  ::std::__cxx11::string::~string((string *)local_78);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)(mbr_idx_local + 2));
  Compiler::set_extended_member_decoration
            ((Compiler *)this,uVar1,*arg_buff_index_local,SPIRVCrossDecorationResourceIndexPrimary,
             *_type_id);
  this_00 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(mbr_idx_local + 0x22);
  TypedID<(spirv_cross::Types)1>::TypedID(local_88,local_38);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back(this_00,local_88);
  *_type_id = ary_type_id + *_type_id;
  *arg_buff_index_local = *arg_buff_index_local + 1;
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_type(uint32_t mbr_type_id, SPIRType &struct_type, uint32_t &mbr_idx,
                                                   uint32_t &arg_buff_index, uint32_t count)
{
	uint32_t type_id = mbr_type_id;
	if (count > 1)
	{
		uint32_t ary_type_id = ir.increase_bound_by(1);
		auto &ary_type = set<SPIRType>(ary_type_id);
		ary_type = get<SPIRType>(type_id);
		ary_type.array.push_back(count);
		ary_type.array_size_literal.push_back(true);
		ary_type.parent_type = type_id;
		type_id = ary_type_id;
	}

	set_member_name(struct_type.self, mbr_idx, join("_m", arg_buff_index, "_pad"));
	set_extended_member_decoration(struct_type.self, mbr_idx, SPIRVCrossDecorationResourceIndexPrimary, arg_buff_index);
	struct_type.member_types.push_back(type_id);

	arg_buff_index += count;
	mbr_idx++;
}